

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_flip_inplace(roaring_bitmap_t *x1,uint64_t range_start,uint64_t range_end)

{
  ushort uVar1;
  uint16_t *puVar2;
  rle16_t *prVar3;
  run_container_t *c;
  _Bool _Var4;
  uint8_t uVar5;
  int iVar6;
  array_container_t *arr;
  run_container_t *prVar7;
  uint64_t uVar8;
  uint16_t lb_end;
  long lVar9;
  ushort uVar10;
  uint8_t type;
  uint16_t lb_start;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint i;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  uint8_t local_4f;
  uint16_t local_4e;
  uint local_4c;
  run_container_t *local_48;
  uint local_3c;
  ulong local_38;
  
  if (range_end <= range_start) {
    return;
  }
  uVar8 = 0;
  if (range_end < 0x100000000) {
    uVar8 = range_end;
  }
  uVar10 = (ushort)(range_start >> 0x10);
  uVar16 = uVar8 - 1;
  lb_end = (uint16_t)uVar16;
  lb_start = (uint16_t)range_start;
  if ((uint16_t)(uVar16 >> 0x10) != uVar10) {
    local_4e = lb_end;
    if (lb_start != 0) {
      inplace_flip_container(&x1->high_low_container,uVar10,lb_start,0xffff);
      uVar10 = uVar10 + 1;
    }
    local_38 = uVar16 & 0xffff;
    local_4c = ((uint)(uVar16 >> 0x10) & 0xffff) - (uint)(local_38 != 0xffff);
    if (uVar10 <= (ushort)local_4c) {
      local_3c = local_4c & 0xffff;
      uVar13 = (uint)uVar10;
      do {
        iVar6 = (x1->high_low_container).size;
        uVar10 = (ushort)uVar13;
        if (((long)iVar6 == 0) ||
           (puVar2 = (x1->high_low_container).keys, puVar2[(long)iVar6 + -1] == uVar10)) {
          i = iVar6 - 1;
        }
        else {
          uVar14 = iVar6 - 1;
          uVar11 = 0;
          uVar15 = uVar14;
          do {
            if ((int)uVar14 < (int)uVar11) {
              i = ~uVar11;
              break;
            }
            i = uVar11 + uVar14 >> 1;
            uVar1 = *(ushort *)((long)puVar2 + (ulong)(uVar11 + uVar14 & 0xfffffffe));
            if (uVar1 < uVar10) {
              uVar11 = i + 1;
              bVar17 = true;
              i = uVar15;
            }
            else if (uVar10 < uVar1) {
              uVar14 = i - 1;
              bVar17 = true;
              i = uVar15;
            }
            else {
              bVar17 = false;
            }
            uVar15 = i;
          } while (bVar17);
        }
        if ((int)i < 0) {
          prVar7 = run_container_create_given_capacity(1);
          if (prVar7 != (run_container_t *)0x0) {
            prVar3 = prVar7->runs;
            iVar6 = prVar7->n_runs;
            prVar3[iVar6].value = 0;
            prVar3[iVar6].length = 0xffff;
            prVar7->n_runs = iVar6 + 1;
          }
          ra_insert_new_key_value_at(&x1->high_low_container,~i,uVar10,prVar7,'\x03');
        }
        else {
          local_4f = (x1->high_low_container).typecodes[i & 0xffff];
          arr = (array_container_t *)(x1->high_low_container).containers[i & 0xffff];
          if (local_4f == '\x04') {
            arr = (array_container_t *)
                  shared_container_extract_copy((shared_container_t *)arr,&local_4f);
          }
          local_48 = (run_container_t *)0x0;
          if (local_4f == '\x03') {
            iVar6 = run_container_negation_range_inplace((run_container_t *)arr,0,0x10000,&local_48)
            ;
            type = (uint8_t)iVar6;
          }
          else if (local_4f == '\x02') {
            prVar7 = (run_container_t *)bitset_container_create();
            local_48 = prVar7;
            memset(prVar7->runs,0xff,0x2000);
            prVar7->n_runs = 0x10000;
            uVar8 = bitset_clear_list((uint64_t *)prVar7->runs,0x10000,arr->array,
                                      (long)arr->cardinality);
            prVar7->n_runs = (int32_t)uVar8;
            array_container_free(arr);
            type = '\x01';
          }
          else {
            if (local_4f != '\x01') {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x186b,"container_t *container_inot(container_t *, uint8_t, uint8_t *)"
                           );
            }
            _Var4 = bitset_container_negation_range_inplace
                              ((bitset_container_t *)arr,0,0x10000,&local_48);
            type = '\x02' - _Var4;
          }
          c = local_48;
          prVar7 = local_48;
          uVar5 = type;
          if (type == '\x04') {
            uVar5 = *(uint8_t *)&local_48->runs;
            if (uVar5 == '\x04') {
              __assert_fail("*type != SHARED_CONTAINER_TYPE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1062,
                            "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                           );
            }
            prVar7 = *(run_container_t **)local_48;
          }
          if (uVar5 == '\x03') {
            lVar9 = cpuid_Extended_Feature_Enumeration_info(7);
            if ((*(uint *)(lVar9 + 4) & 0x20) == 0) {
              iVar6 = prVar7->n_runs;
              lVar9 = (long)iVar6;
              if (0 < lVar9) {
                lVar12 = 0;
                do {
                  iVar6 = iVar6 + (uint)prVar7->runs[lVar12].length;
                  lVar12 = lVar12 + 1;
                } while (lVar9 != lVar12);
              }
            }
            else {
              iVar6 = _avx2_run_container_cardinality(prVar7);
            }
          }
          else {
            if ((uVar5 != '\x02') && (uVar5 != '\x01')) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
            }
            iVar6 = prVar7->n_runs;
          }
          if (iVar6 == 0) {
            container_free(c,type);
            ra_remove_at_index(&x1->high_low_container,i);
          }
          else {
            if ((x1->high_low_container).size <= (int)i) {
              __assert_fail("i < ra->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1a3a,
                            "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                           );
            }
            (x1->high_low_container).containers[i] = c;
            (x1->high_low_container).typecodes[i] = type;
          }
        }
        bVar17 = uVar13 != local_3c;
        uVar13 = uVar13 + 1;
      } while (bVar17);
    }
    if ((int)local_38 == 0xffff) {
      return;
    }
    uVar10 = (short)local_4c + 1;
    lb_start = 0;
    lb_end = local_4e;
  }
  inplace_flip_container(&x1->high_low_container,uVar10,lb_start,lb_end);
  return;
}

Assistant:

void roaring_bitmap_flip_inplace(roaring_bitmap_t *x1, uint64_t range_start,
                                 uint64_t range_end) {
    if (range_start >= range_end) {
        return;  // empty range
    }
    if(range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;
    uint16_t hb_end = (uint16_t)((range_end - 1) >> 16);
    const uint16_t lb_end = (uint16_t)(range_end - 1);

    if (hb_start == hb_end) {
        inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                               lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                                   0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            inplace_fully_flip_container(&x1->high_low_container, hb);
        }
        // handle a partial final container
        if (lb_end != 0xFFFF) {
            inplace_flip_container(&x1->high_low_container, hb_end + 1, 0,
                                   lb_end);
            ++hb_end;
        }
    }
}